

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

string * __thiscall
Catch::extractClassName_abi_cxx11_
          (string *__return_storage_ptr__,Catch *this,StringRef *classOrQualifiedMethodName)

{
  string local_30 [32];
  
  StringRef::operator_cast_to_string(__return_storage_ptr__,(StringRef *)this);
  if ((__return_storage_ptr__->_M_string_length != 0) &&
     (*(__return_storage_ptr__->_M_dataplus)._M_p == '&')) {
    std::__cxx11::string::rfind((char *)__return_storage_ptr__,0x1c07b8);
    std::__cxx11::string::rfind((char *)__return_storage_ptr__,0x1c07b8);
    std::__cxx11::string::substr((ulong)local_30,(ulong)__return_storage_ptr__);
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,local_30);
    std::__cxx11::string::~string(local_30);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string extractClassName( StringRef const& classOrQualifiedMethodName ) {
        std::string className(classOrQualifiedMethodName);
        if( startsWith( className, '&' ) )
        {
            std::size_t lastColons = className.rfind( "::" );
            std::size_t penultimateColons = className.rfind( "::", lastColons-1 );
            if( penultimateColons == std::string::npos )
                penultimateColons = 1;
            className = className.substr( penultimateColons, lastColons-penultimateColons );
        }
        return className;
    }